

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sha1.c
# Opt level: O0

void csp_sha1_process(csp_sha1_state_t *sha1,void *data,uint32_t inlen)

{
  uint in_EDX;
  void *in_RSI;
  long *in_RDI;
  uint32_t n;
  uint8_t *in;
  uint8_t *in_stack_000000b8;
  csp_sha1_state_t *in_stack_000000c0;
  uint local_28;
  void *local_20;
  uint local_14;
  
  local_20 = in_RSI;
  local_14 = in_EDX;
  while (local_14 != 0) {
    if ((*(int *)((long)in_RDI + 0x1c) == 0) && (0x3f < local_14)) {
      csp_sha1_compress(in_stack_000000c0,in_stack_000000b8);
      *in_RDI = *in_RDI + 0x200;
      local_20 = (void *)((long)local_20 + 0x40);
      local_14 = local_14 - 0x40;
    }
    else {
      if (local_14 < 0x40U - *(int *)((long)in_RDI + 0x1c)) {
        local_28 = local_14;
      }
      else {
        local_28 = 0x40 - *(int *)((long)in_RDI + 0x1c);
      }
      memcpy((void *)((long)in_RDI + (ulong)*(uint *)((long)in_RDI + 0x1c) + 0x20),local_20,
             (ulong)local_28);
      *(uint *)((long)in_RDI + 0x1c) = local_28 + *(int *)((long)in_RDI + 0x1c);
      local_20 = (void *)((long)local_20 + (ulong)local_28);
      local_14 = local_14 - local_28;
      if (*(int *)((long)in_RDI + 0x1c) == 0x40) {
        csp_sha1_compress(in_stack_000000c0,in_stack_000000b8);
        *in_RDI = *in_RDI + 0x200;
        *(undefined4 *)((long)in_RDI + 0x1c) = 0;
      }
    }
  }
  return;
}

Assistant:

void csp_sha1_process(csp_sha1_state_t * sha1, const void * data, uint32_t inlen) {

	const uint8_t * in = data;
	uint32_t n;
	while (inlen > 0) {
		if (sha1->curlen == 0 && inlen >= CSP_SHA1_BLOCKSIZE) {
			csp_sha1_compress(sha1, in);
			sha1->length += (CSP_SHA1_BLOCKSIZE * 8);
			in += CSP_SHA1_BLOCKSIZE;
			inlen -= CSP_SHA1_BLOCKSIZE;
		} else {
			n = MIN(inlen, (CSP_SHA1_BLOCKSIZE - sha1->curlen));
			memcpy(sha1->buf + sha1->curlen, in, (size_t)n);
			sha1->curlen += n;
			in += n;
			inlen -= n;
			if (sha1->curlen == CSP_SHA1_BLOCKSIZE) {
				csp_sha1_compress(sha1, sha1->buf);
				sha1->length += (CSP_SHA1_BLOCKSIZE * 8);
				sha1->curlen = 0;
			}
		}
	}
}